

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

void __thiscall common::anon_unknown_0::CleanupHandler::~CleanupHandler(CleanupHandler *this)

{
  long lVar1;
  bool bVar2;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  function<void_()> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = &PTR__CleanupHandler_01618c80;
  bVar2 = std::function::operator_cast_to_bool(in_stack_ffffffffffffffd8);
  if (bVar2) {
    std::function<void_()>::operator()(in_stack_ffffffffffffffd8);
    std::function<void_()>::operator=
              ((function<void_()> *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
               in_RDI);
  }
  std::function<void_()>::~function(in_stack_ffffffffffffffd8);
  interfaces::Handler::~Handler((Handler *)in_stack_ffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

~CleanupHandler() override { if (!m_cleanup) return; m_cleanup(); m_cleanup = nullptr; }